

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

Variable __thiscall
LiteScript::_Type_STRING::OAssign(_Type_STRING *this,Variable *src,Variable *dest)

{
  bool bVar1;
  Object *pOVar2;
  Type *pTVar3;
  String *string;
  String *this_00;
  Variable *in_RCX;
  uint *extraout_RDX;
  Variable VVar4;
  Variable local_38;
  Variable *local_28;
  Variable *dest_local;
  Variable *src_local;
  _Type_STRING *this_local;
  
  local_28 = in_RCX;
  dest_local = dest;
  src_local = src;
  this_local = this;
  pOVar2 = Variable::operator->(in_RCX);
  pTVar3 = Object::GetType(pOVar2);
  bVar1 = Type::operator!=(pTVar3,(Type *)src);
  if (bVar1) {
    pOVar2 = Variable::operator->(local_28);
    pTVar3 = Object::GetType(pOVar2);
    pOVar2 = Variable::operator*(dest_local);
    (*pTVar3->_vptr_Type[1])(pTVar3,pOVar2);
    pOVar2 = Variable::operator->(dest_local);
    pTVar3 = Object::GetType(pOVar2);
    (*pTVar3->_vptr_Type[3])(&local_38,pTVar3,dest_local,local_28);
    Variable::~Variable(&local_38);
  }
  else {
    pOVar2 = Variable::operator->(local_28);
    string = Object::GetData<LiteScript::String>(pOVar2);
    pOVar2 = Variable::operator->(dest_local);
    this_00 = Object::GetData<LiteScript::String>(pOVar2);
    String::operator=(this_00,string);
  }
  Variable::Variable((Variable *)this,dest_local);
  VVar4.nb_ref = extraout_RDX;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::_Type_STRING::OAssign(LiteScript::Variable& src, const LiteScript::Variable& dest) const {
    if (dest->GetType() != *this) {
        dest->GetType().AssignObject(*src);
        src->GetType().OAssign(src, dest);
    }
    else {
        src->GetData<String>() = dest->GetData<String>();
    }
    return Variable(src);
}